

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# control.cpp
# Opt level: O1

bool Control::applyPressureControls(Network *network)

{
  double *pdVar1;
  double dVar2;
  pointer ppCVar3;
  Control *this;
  bool bVar4;
  bool bVar5;
  pointer ppCVar6;
  
  ppCVar6 = (network->controls).super__Vector_base<Control_*,_std::allocator<Control_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppCVar3 = (network->controls).super__Vector_base<Control_*,_std::allocator<Control_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppCVar6 == ppCVar3) {
    bVar5 = false;
  }
  else {
    bVar5 = false;
    do {
      this = *ppCVar6;
      if (*(int *)&(this->super_Element).field_0x2c == 1) {
        if (this->levelType == HI_LEVEL) {
          dVar2 = this->node->head;
          if (this->head <= dVar2 && dVar2 != this->head) goto LAB_0012b787;
        }
        else if ((this->levelType == LOW_LEVEL) &&
                (pdVar1 = &this->node->head, *pdVar1 <= this->head && this->head != *pdVar1)) {
LAB_0012b787:
          bVar4 = activate(this,true,(ostream *)&network->msgLog);
          if (bVar4) {
            bVar5 = true;
          }
        }
      }
      ppCVar6 = ppCVar6 + 1;
    } while (ppCVar6 != ppCVar3);
  }
  return bVar5;
}

Assistant:

bool Control::applyPressureControls(Network* network)
{
    bool makeChange = true;
    bool changed = false;

    for (Control* control : network->controls)
    {
        if ( control->type == PRESSURE_LEVEL )
        {
            if ( (control->levelType == LOW_LEVEL &&
                  control->node->head < control->head)
            ||   (control->levelType == HI_LEVEL &&
                  control->node->head > control->head) )
            {
                if (control->activate(makeChange, network->msgLog))
                    changed = true;
            }
        }
    }

    return changed;
}